

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_serpent.cpp
# Opt level: O1

int AF_A_SerpentMeleeAttack
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *this;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  FString *this_00;
  VMValue *pVVar9;
  AActor *pAVar10;
  char *__assertion;
  long lVar11;
  bool bVar12;
  VMValue params [3];
  FSoundID local_78;
  FName local_74;
  DAngle local_70;
  anon_union_16_5_cf148060_for_VMValue_0 local_68;
  AActor *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  FString local_48;
  undefined4 local_40;
  char local_3c [12];
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005c1505;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    this = (AActor *)(param->field_0).field_1.a;
    pVVar9 = param;
    uVar5 = numparam;
    if (this != (AActor *)0x0) {
      if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar8 = (this->super_DThinker).super_DObject.Class;
      bVar12 = pPVar8 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar12;
      uVar5 = (uint)bVar12;
      pVVar9 = (VMValue *)(ulong)(pPVar8 == pPVar3 || bVar12);
      if (pPVar8 != pPVar3 && !bVar12) {
        do {
          pPVar8 = pPVar8->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
          if (pPVar8 == pPVar3) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005c1505;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005c14da;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar7 = (**(code **)*puVar2)(puVar2,pVVar9,uVar5,ret);
          puVar2[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar2[1];
        bVar12 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar3 && bVar12) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar12 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar3) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar12) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005c1505;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      pAVar10 = (this->target).field_0.p;
      if (pAVar10 != (AActor *)0x0) {
        if (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          bVar12 = AActor::CheckMeleeRange(this);
          if (bVar12) {
            uVar5 = FRandom::GenRand32(&pr_serpentmeattack);
            iVar4 = (uVar5 & 7) * 5 + 5;
            pAVar10 = (this->target).field_0.p;
            if ((pAVar10 != (AActor *)0x0) &&
               (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (this->target).field_0.p = (AActor *)0x0;
              pAVar10 = (AActor *)0x0;
            }
            local_74.Index = 0x84;
            local_70.Degrees = 0.0;
            iVar6 = P_DamageMobj(pAVar10,this,this,iVar4,&local_74,0,&local_70);
            if (0 < iVar6) {
              iVar4 = iVar6;
            }
            pAVar10 = (this->target).field_0.p;
            if ((pAVar10 != (AActor *)0x0) &&
               (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (this->target).field_0.p = (AActor *)0x0;
              pAVar10 = (AActor *)0x0;
            }
            P_TraceBleed(iVar4,pAVar10,this);
            local_78.ID = S_FindSound("SerpentMeleeHit");
            S_Sound(this,4,&local_78,1.0,1.0);
          }
          uVar5 = FRandom::GenRand32(&pr_serpentmeattack);
          if ((uVar5 & 0xe0) < 0x60) {
            local_68.field_1.atag = 1;
            local_68.field_3.Type = '\x03';
            local_50 = 1;
            local_4c = 3;
            local_48.Chars = (char *)0x0;
            local_40 = 8;
            local_3c[0] = 3;
            local_68.field_1.a = this;
            local_58 = this;
            VMFrameStack::Call(stack,&A_SerpentCheckForAttack_VMPtr->super_VMFunction,
                               (VMValue *)&local_68.field_1,3,(VMReturn *)0x0,0,(VMException **)0x0)
            ;
            lVar11 = -0x30;
            this_00 = &local_48;
            do {
              if (*(char *)((long)&this_00[1].Chars + 4) == '\x02') {
                FString::~FString(this_00);
              }
              this_00 = this_00 + -2;
              lVar11 = lVar11 + 0x10;
            } while (lVar11 != 0);
          }
        }
        else {
          (this->target).field_0.p = (AActor *)0x0;
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005c14da:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005c1505:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                ,0xbf,"int AF_A_SerpentMeleeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SerpentMeleeAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
	{
		return 0;
	}
	if (self->CheckMeleeRange ())
	{
		int damage = pr_serpentmeattack.HitDice (5);
		int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
		S_Sound (self, CHAN_BODY, "SerpentMeleeHit", 1, ATTN_NORM);
	}
	if (pr_serpentmeattack() < 96)
	{
		CALL_ACTION(A_SerpentCheckForAttack, self);
	}
	return 0;
}